

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMT_PUBLIC_Unmarshal(TPMT_PUBLIC *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_PUBLIC_Unmarshal(&target->type,buffer,size);
  if (TVar1 == 0) {
    TVar1 = TPMI_ALG_HASH_Unmarshal(&target->nameAlg,buffer,size,flag);
    if (TVar1 == 0) {
      TVar1 = TPMA_OBJECT_Unmarshal(&target->objectAttributes,buffer,size);
      if (TVar1 == 0) {
        TVar1 = TPM2B_DIGEST_Unmarshal(&target->authPolicy,buffer,size);
        if (TVar1 == 0) {
          TVar1 = TPMU_PUBLIC_PARMS_Unmarshal(&target->parameters,buffer,size,(uint)target->type);
          if (TVar1 == 0) {
            TVar1 = TPMU_PUBLIC_ID_Unmarshal(&target->unique,buffer,size,(uint)target->type);
            return TVar1;
          }
        }
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMT_PUBLIC_Unmarshal(TPMT_PUBLIC *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPMI_ALG_PUBLIC_Unmarshal((TPMI_ALG_PUBLIC *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&(target->nameAlg), buffer, size, flag);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_OBJECT_Unmarshal((TPMA_OBJECT *)&(target->objectAttributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->authPolicy), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_PUBLIC_PARMS_Unmarshal((TPMU_PUBLIC_PARMS *)&(target->parameters), buffer, size, (UINT32)target->type);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_PUBLIC_ID_Unmarshal((TPMU_PUBLIC_ID *)&(target->unique), buffer, size, (UINT32)target->type);
    return result;
}